

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O3

void __thiscall
wasm::ModAsyncify<true,_false,_true>::visitSelect(ModAsyncify<true,_false,_true> *this,Select *curr)

{
  Const *pCVar1;
  Builder local_18;
  Builder builder;
  
  if ((curr->condition->_id == GlobalGetId) &&
     ((char *)curr->condition[1].type.id == (this->asyncifyStateName).super_IString.str._M_str)) {
    local_18.wasm =
         (this->
         super_WalkerPass<wasm::LinearExecutionWalker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>_>
         ).
         super_LinearExecutionWalker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
         .
         super_PostWalker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
         .
         super_Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
         .currModule;
    pCVar1 = Builder::makeConst<int>(&local_18,0);
    curr->condition = (Expression *)pCVar1;
    return;
  }
  return;
}

Assistant:

void visitSelect(Select* curr) {
    auto* get = curr->condition->dynCast<GlobalGet>();
    if (!get || get->name != asyncifyStateName) {
      return;
    }
    // This is a comparison of the state to zero, which means we are checking
    // "if running normally, run this code, but if rewinding, ignore it". If
    // we know we'll never rewind, we can optimize this.
    if (neverRewind) {
      Builder builder(*this->getModule());
      curr->condition = builder.makeConst(int32_t(0));
    }
  }